

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  MCode *pMVar1;
  byte *pbVar2;
  char cVar3;
  uint8_t uVar4;
  ushort uVar5;
  ExitNo exitno;
  SnapEntry *pSVar6;
  SnapShot *pSVar7;
  Reg down;
  Reg RVar8;
  TraceError e;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  ushort uVar13;
  Reg RVar14;
  GCtrace *pGVar15;
  IRIns *pIVar16;
  ulong uVar17;
  SnapShot *pSVar18;
  MCode MVar19;
  uint uVar20;
  SnapEntry i;
  uint uVar21;
  uint16_t *puVar22;
  MCode *pMVar23;
  int32_t iVar24;
  ulong uVar25;
  long lVar26;
  IRIns *pIVar27;
  uint uVar28;
  int iVar29;
  RegSet RVar30;
  IRRef1 IVar31;
  MSize MVar32;
  int iVar33;
  long lVar34;
  MCode MVar35;
  MCode MVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint *puVar40;
  SnapEntry sn;
  SnapEntry *local_448;
  ASMState local_408;
  CCallInfo local_78 [4];
  ulong uVar41;
  
  uVar25 = (ulong)(T->nins - 1);
  cVar3 = *(char *)((long)T->ir + uVar25 * 8 + 5);
  if ((cVar3 == '\x14') || (cVar3 == '\f')) {
    while ((cVar3 = *(char *)((long)T->ir + uVar25 * 8 + -3), cVar3 == '\x14' || (cVar3 == '\f'))) {
      uVar25 = uVar25 - 1;
    }
    T->nins = (IRRef)uVar25;
  }
  uVar20 = (J->cur).nins;
  if (J->irtoplim <= uVar20) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar20 + 1;
  (J->cur).ir[uVar20] = (IRIns)0xc0000000000;
  local_408.J = J;
  local_408.orignins = uVar20;
  local_408.T = T;
  pGVar15 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar15;
  local_408.flags = J->flags;
  local_408.loopref = J->loopref;
  local_408.realign = (MCode *)0x0;
  local_408.loopinv = 0;
  if ((ulong)J->parent == 0) {
    local_408.parent = (GCtrace *)0x0;
  }
  else {
    local_408.parent = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  }
  local_408.mcp = lj_mcode_reserve(J,&local_408.mcbot);
  local_408.mctoporig = local_408.mcp;
  local_408.mctop = local_408.mcp;
  local_408.mclim = local_408.mcbot + 0x40;
  uVar13 = (local_408.T)->nsnap;
  if (uVar13 < 0x200) {
    MVar19 = '\x01';
    for (uVar25 = 0; pMVar23 = local_408.mcbot, uVar25 != uVar13 + 0x1f >> 5; uVar25 = uVar25 + 1) {
      if ((local_408.J)->exitstubgroup[uVar25] == (MCode *)0x0) {
        if (local_408.mcp <= local_408.mcbot + 0x8d) goto LAB_00140a35;
        *local_408.mcbot = 'j';
        local_408.mcbot[1] = (MCode)((int)uVar25 << 5);
        MVar35 = 'z';
        MVar36 = MVar19;
        for (lVar34 = 0; (int)lVar34 != 0x7c; lVar34 = lVar34 + 4) {
          local_408.mcbot[lVar34 + 2] = 0xeb;
          local_408.mcbot[lVar34 + 3] = MVar35;
          local_408.mcbot[lVar34 + 4] = 'j';
          local_408.mcbot[lVar34 + 5] = MVar36;
          MVar36 = MVar36 + '\x01';
          MVar35 = MVar35 + 0xfc;
        }
        local_408.mcbot[lVar34 + 2] = 'j';
        local_408.mcbot[lVar34 + 3] = (MCode)(uVar25 >> 3);
        pMVar1 = local_408.mcbot + lVar34 + 4;
        pMVar1[0] = 199;
        pMVar1[1] = 'D';
        pMVar1[2] = '$';
        pMVar1[3] = '\x10';
        *(int *)(local_408.mcbot + lVar34 + 8) = (int)local_408.J + 0xaa0;
        local_408.mcbot[lVar34 + 0xc] = 0xe9;
        *(int *)(local_408.mcbot + lVar34 + 0xd) = 0x13de52 - (int)local_408.mcbot;
        (local_408.J)->mcbot = local_408.mcbot + lVar34 + 0x11;
        local_408.mcbot = local_408.mcbot + lVar34 + 0x11;
        local_408.mclim = pMVar23 + lVar34 + 0x51;
        (local_408.J)->exitstubgroup[uVar25] = pMVar23;
      }
      MVar19 = MVar19 + ' ';
    }
    local_408.mrm.base = '\0';
    pGVar15 = J->curfinal;
LAB_0013f87f:
    do {
      local_408.ir = pGVar15->ir;
      (J->cur).nins = local_408.orignins;
      pMVar23 = local_408.mctop;
      if (local_408.realign != (MCode *)0x0) {
        for (uVar20 = (uint)local_408.realign & 0xf; 0 < (int)uVar20; uVar20 = uVar20 - 1) {
          local_408.mctop[-1] = 0x90;
          local_408.mctop = local_408.mctop + -1;
        }
        pMVar23 = local_408.mctop + (ulong)(local_408.loopinv == 0) * 3;
      }
      local_408.invmcp = pMVar23 + -5;
      local_408.mcp = local_408.invmcp;
      if (local_408.loopref == 0) {
        local_408.invmcp = (MCode *)0x0;
        local_408.mcp = pMVar23 + -0xc;
      }
      local_408.mcloop = (MCode *)0x0;
      local_408.flagmcp = (MCode *)0x0;
      local_408.topslot = 0;
      local_408.gcsteps = 0;
      local_408.sectref = local_408.loopref;
      local_408.fuseref = local_408.loopref;
      if ((local_408.flags >> 0x19 & 1) == 0) {
        local_408.fuseref = 0xffffffff;
      }
      uVar4 = (local_408.T)->sinktags;
      local_408.curins = (local_408.T)->nins;
      uVar25 = (ulong)local_408.curins;
      local_408.freeset = 0xffffffef;
      local_408.modset = 0;
      local_408.weakset = 0;
      local_408.phiset = 0;
      local_408.phireg[0x18] = 0;
      local_408.phireg[0x19] = 0;
      local_408.phireg[0x1a] = 0;
      local_408.phireg[0x1b] = 0;
      local_408.phireg[0x1c] = 0;
      local_408.phireg[0x1d] = 0;
      local_408.phireg[0x1e] = 0;
      local_408.phireg[0x1f] = 0;
      local_408.phireg[0x10] = 0;
      local_408.phireg[0x11] = 0;
      local_408.phireg[0x12] = 0;
      local_408.phireg[0x13] = 0;
      local_408.phireg[0x14] = 0;
      local_408.phireg[0x15] = 0;
      local_408.phireg[0x16] = 0;
      local_408.phireg[0x17] = 0;
      local_408.phireg[8] = 0;
      local_408.phireg[9] = 0;
      local_408.phireg[10] = 0;
      local_408.phireg[0xb] = 0;
      local_408.phireg[0xc] = 0;
      local_408.phireg[0xd] = 0;
      local_408.phireg[0xe] = 0;
      local_408.phireg[0xf] = 0;
      local_408.phireg[0] = 0;
      local_408.phireg[1] = 0;
      local_408.phireg[2] = 0;
      local_408.phireg[3] = 0;
      local_408.phireg[4] = 0;
      local_408.phireg[5] = 0;
      local_408.phireg[6] = 0;
      local_408.phireg[7] = 0;
      for (lVar34 = 0; lVar34 != 0x20; lVar34 = lVar34 + 1) {
        local_408.cost[lVar34] = 0xffff0000;
      }
      lVar34 = (ulong)(local_408.T)->nk << 3;
      while (lVar34 < 0x40000) {
        *(undefined2 *)((long)local_408.ir + lVar34 + 6) = 0xff;
        lVar26 = lVar34;
        if (((0x604208U >> (*(uint *)((long)local_408.ir + lVar34 + 4) & 0x1f) & 1) != 0) &&
           (*(char *)((long)local_408.ir + lVar34 + 5) != '\x1b')) {
          lVar26 = lVar34 + 8;
          *(int *)((long)local_408.ir + lVar34) = (int)lVar26 + (int)local_408.ir;
        }
        lVar34 = lVar26 + 8;
      }
      *(undefined2 *)((long)local_408.ir + 0x40006) = 0x82;
      local_408.snaprename = local_408.curins;
      local_408.snapref = local_408.curins;
      local_408.snapno = (uint)(local_408.T)->nsnap;
      local_408.snapalloc = 0;
      local_408.stopins = 0x8000;
      local_408.orignins = local_408.curins;
      pIVar27 = local_408.ir + 0x8001;
      if (local_408.parent != (GCtrace *)0x0) {
        pIVar16 = lj_snap_regspmap(local_408.J,local_408.parent,(local_408.J)->exitno,pIVar27);
        if (2000 < (long)pIVar16 - (long)pIVar27) {
LAB_00140be8:
          e = LJ_TRERR_NYICOAL;
          goto LAB_00140bf2;
        }
        local_408.stopins = (uint)((ulong)((long)pIVar16 + (-8 - (long)local_408.ir)) >> 3);
        puVar22 = local_408.parentmap;
        for (; pIVar27 < pIVar16; pIVar27 = pIVar27 + 1) {
          uVar13 = (pIVar27->field_0).prev;
          *puVar22 = uVar13;
          puVar22 = puVar22 + 1;
          IVar31 = uVar13 | 0x80;
          if (0xff < uVar13) {
            IVar31 = 0xff;
          }
          (pIVar27->field_0).prev = IVar31;
        }
      }
      local_408.evenspill = 2;
      pIVar16 = local_408.ir + uVar25;
      bVar9 = false;
      for (; iVar24 = local_408.evenspill, pIVar27 < pIVar16; pIVar27 = pIVar27 + 1) {
        if (uVar4 != '\0') {
          if ((pIVar27->field_1).r != 0xfe) {
            if ((pIVar27->field_1).r != 0xfd) goto LAB_0013fb1c;
            (pIVar27->field_1).r = 0xfe;
          }
          goto LAB_0013fd35;
        }
LAB_0013fb1c:
        switch((pIVar27->field_1).o) {
        case '\x11':
          bVar9 = true;
          goto switchD_0013fb33_caseD_41;
        default:
          uVar13 = (pIVar27->field_0).op2;
LAB_0013fd02:
          if ((((short)uVar13 < 0) || (-1 < (short)(pIVar27->field_0).op1)) ||
             (uVar13 = *(ushort *)((long)local_408.ir + (ulong)(pIVar27->field_0).op1 * 8 + 6),
             0xfc < (uVar13 & 0xff))) goto switchD_0013fb33_caseD_41;
          (pIVar27->field_0).prev = uVar13;
          break;
        case '$':
        case '%':
        case '&':
          if ((local_408.flags & 0x40) == 0) goto switchD_0013fb33_caseD_27;
          goto switchD_0013fb33_caseD_41;
        case '\'':
        case '(':
switchD_0013fb33_caseD_27:
          uVar13 = (pIVar27->field_0).op2;
          if (((short)uVar13 < 0) && (0xfc < *(byte *)((long)local_408.ir + (ulong)uVar13 * 8 + 6)))
          {
            *(undefined1 *)((long)local_408.ir + (ulong)uVar13 * 8 + 6) = 0x81;
            if (!bVar9) goto LAB_0013fd2c;
            local_408._168_8_ = local_408._168_8_ | 0x200000000;
          }
          goto switchD_0013fb33_caseD_41;
        case ',':
        case '-':
switchD_0013fb33_caseD_2c:
          if (((pIVar27->field_1).t.irt & 0x1f) == 0xe) goto switchD_0013fb33_caseD_41;
          (pIVar27->field_0).prev = 0x80;
          if (!bVar9) goto LAB_0013fc8a;
          local_408._168_8_ = local_408._168_8_ | 0xfc700000000;
          break;
        case '.':
          if (((pIVar27->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013fb33_caseD_2c;
LAB_0013fc47:
          if (bVar9) {
            local_408._168_8_ = local_408._168_8_ | 0xffff0fc700000000;
          }
          (pIVar27->field_0).prev = 0x90;
          break;
        case '4':
          if (2 < (pIVar27->field_0).op2) goto LAB_0013fc47;
          if ((local_408.flags & 0x20) != 0) goto switchD_0013fb33_caseD_41;
          (pIVar27->field_0).prev = 0x90;
          if (!bVar9) goto LAB_0013fc8a;
          local_408._168_8_ = local_408._168_8_ | 0xf000100000000;
          break;
        case ';':
        case 'M':
        case 'N':
        case 'O':
        case 'P':
        case 'Q':
        case 'R':
        case 'T':
        case 'U':
        case '[':
          (pIVar27->field_0).prev = 0x80;
          if (bVar9) {
            local_408.modset = 0xffff0fc7;
          }
          else {
LAB_0013fc8a:
            bVar9 = false;
          }
          break;
        case 'A':
        case 'B':
        case 'C':
        case 'E':
        case 'G':
        case 'Z':
          goto switchD_0013fb33_caseD_41;
        case 'W':
        case '\\':
          if (bVar9) {
            local_408.modset = 0xffff0fc7;
          }
          else {
LAB_0013fd2c:
            bVar9 = false;
          }
          goto switchD_0013fb33_caseD_41;
        case 'Y':
          if ((1 < (byte)(((pIVar27->field_1).t.irt & 0x1f) - 0xd)) &&
             (uVar13 = (pIVar27->field_0).op2, 1 < (ushort)((uVar13 & 0x1f) - 0xd)))
          goto LAB_0013fd02;
switchD_0013fb33_caseD_41:
          (pIVar27->field_0).prev = 0xff;
          break;
        case ']':
        case '^':
        case '_':
        case '`':
          uVar13 = (pIVar27->field_0).op2;
          RVar14 = asm_setup_call_slots(&local_408,pIVar27,lj_ir_callinfo + uVar13);
          (pIVar27->field_0).prev = (IRRef1)RVar14;
          if (bVar9) {
            local_408.modset =
                 local_408.modset |
                 (uint)((*(byte *)((long)&lj_ir_callinfo[uVar13].flags + 1) & 4) >> 2) * 0x10000 -
                 0xf039;
          }
          else {
            bVar9 = false;
          }
          break;
        case 'a':
          local_78[0].flags = asm_callx_flags(&local_408,pIVar27);
          RVar14 = asm_setup_call_slots(&local_408,pIVar27,local_78);
          (pIVar27->field_0).prev = (IRRef1)RVar14;
          if (bVar9) {
            local_408._168_8_ = local_408._168_8_ | 0xffff0fc700000000;
          }
        }
LAB_0013fd35:
      }
      local_408.oddspill = 0;
      if ((local_408.evenspill & 1U) != 0) {
        local_408.evenspill = local_408.evenspill + 1;
        local_408.oddspill = iVar24;
      }
      if (local_408.loopref == 0) {
        uVar20 = (local_408.T)->nsnap - 1;
        pSVar18 = (local_408.T)->snap;
        pSVar7 = pSVar18 + uVar20;
        uVar25 = (ulong)pSVar18[uVar20].nent;
        do {
          uVar17 = uVar25;
          if (uVar17 == 0) {
            uVar28 = 0;
            goto LAB_0013fdc0;
          }
          uVar25 = uVar17 - 1;
        } while (((local_408.T)->snapmap[(ulong)pSVar18[uVar20].mapofs + (uVar17 - 1)] >> 0x10 & 1)
                 == 0);
        uVar28 = (local_408.T)->snapmap[(ulong)pSVar18[uVar20].mapofs + (uVar17 - 1)] >> 0x18;
LAB_0013fdc0:
        local_408.topslot = (uint)pSVar7->topslot;
        if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
        ra_allocref(&local_408,0x8000,4);
        if ((local_408.T)->link == 0) {
          puVar40 = (uint *)(ulong)(local_408.T)->snapmap[(uint)pSVar7->nent + pSVar7->mapofs];
          if (((char)*puVar40 == 'W') &&
             (uVar25 = (ulong)(local_408.J)->trace[*puVar40 >> 0x10].gcptr32,
             0xfffffffb < *(byte *)(uVar25 + 0x38) - 0x4d)) {
            puVar40 = (uint *)(uVar25 + 0x38);
          }
          emit_loadi(&local_408,0xe,(int)local_408.J + 0xaa0);
          emit_loadi(&local_408,3,(int32_t)puVar40);
          iVar24 = pSVar7->nslots - uVar28;
          uVar39 = *puVar40;
          uVar37 = (uVar39 & 0xff) - 0x3f;
          uVar37 = uVar37 >> 1 | (uint)((uVar37 & 1) != 0) << 0x1f;
          if (uVar37 - 1 < 2) {
            uVar37 = uVar39 >> 0x10 & 0xff;
            iVar24 = iVar24 + (~uVar39 >> 8 | 0xffffff00);
LAB_0013feec:
            iVar24 = iVar24 - uVar37;
          }
          else {
            if (uVar37 == 0) {
              uVar37 = uVar39 >> 8 & 0xff;
              goto LAB_0013feec;
            }
            if (uVar37 == 5) {
              uVar37 = (uVar39 >> 0x10) + (uVar39 >> 8 & 0xff);
              goto LAB_0013feec;
            }
            if ((uVar39 & 0xff) < 0x59) {
              iVar24 = 0;
            }
          }
          emit_loadi(&local_408,0,iVar24);
        }
        else if (uVar28 != 0) {
          *(int *)(local_408.mcp + -4) = (int)local_408.J + -0xb8;
          local_408.mcp[-5] = '%';
          local_408.mcp[-7] = 0x89;
          local_408.mcp[-6] = '\x14';
          local_408.mcp = local_408.mcp + -7;
        }
        emit_addptr(&local_408,2,uVar28 << 3);
        if ((ulong)(local_408.J)->ktrace != 0) {
          local_408.ir[(local_408.J)->ktrace].field_1.op12 = *(IRRef2 *)&(local_408.J)->curfinal;
          *(undefined1 *)((long)local_408.ir + (ulong)(local_408.J)->ktrace * 8 + 5) = 0x18;
        }
        pSVar6 = (local_408.T)->snapmap;
        uVar28 = pSVar7->mapofs;
        pSVar18 = (SnapShot *)&(local_408.T)->nsnapmap;
        if (pSVar7 + 1 != (local_408.T)->snap + (local_408.T)->nsnap) {
          pSVar18 = pSVar7 + 1;
        }
        local_448 = pSVar6 + (pSVar18->mapofs - 1);
        bVar12 = pSVar7->nent;
        for (uVar25 = 0; pIVar27 = local_408.ir, bVar12 != uVar25; uVar25 = uVar25 + 1) {
          uVar37 = pSVar6[uVar28 + uVar25];
          if ((uVar37 >> 0x12 & 1) == 0) {
            iVar29 = (uVar37 >> 0x18) * 8 + -8;
            uVar39 = uVar37 & 0xffff;
            uVar41 = (ulong)uVar39;
            bVar11 = *(byte *)((long)local_408.ir + uVar41 * 8 + 4) & 0x1f;
            if (bVar11 == 0xe) {
              RVar14 = ra_alloc1(&local_408,uVar39,0xffff0000);
              emit_rmro(&local_408,XO_MOVSDto,RVar14,2,iVar29);
            }
            else {
              if (uVar39 < 0x8000) {
                if (2 < bVar11) {
                  emit_movmroi(&local_408,2,iVar29,local_408.ir[uVar41].i);
                }
              }
              else {
                RVar14 = ra_alloc1(&local_408,uVar39,0xffeb);
                emit_rmro(&local_408,XO_MOVto,
                          -(uint)((0x604208U >> (*(uint *)((long)pIVar27 + uVar41 * 8 + 4) & 0x1f) &
                                  1) != 0) & 0x80200 | RVar14,2,iVar29);
              }
              if ((uVar37 & 0x30000) == 0) {
                bVar11 = *(byte *)((long)pIVar27 + uVar41 * 8 + 4) & 0x1f;
                if (bVar11 != 3) {
                  i = (SnapEntry)(char)~bVar11;
                  goto LAB_001400cd;
                }
              }
              else if (0xffffff < uVar37) {
                i = *local_448;
                local_448 = local_448 + -1;
LAB_001400cd:
                emit_movmroi(&local_408,2,(uVar37 >> 0x18) * 8 + -4,i);
              }
            }
            if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
          }
        }
        if ((uVar17 != 0) && (local_408.parent == (GCtrace *)0x0)) {
          asm_stack_check(&local_408,local_408.topslot,(IRIns *)0x0,local_408.freeset & 0xffef,
                          uVar20);
        }
      }
      while( true ) {
        local_408.curins = local_408.curins - 1;
        if (local_408.curins <= local_408.stopins) break;
        pIVar27 = local_408.ir + local_408.curins;
        asm_snap_prev(&local_408);
        if ((((-1 < (char)(pIVar27->field_1).r) || ((pIVar27->field_1).s != '\0')) ||
            (0x5f < (((pIVar27->field_1).t.irt | 0x60) & lj_ir_mode[(pIVar27->field_1).o]))) ||
           ((local_408.flags & 0x40000) == 0)) {
          if ((char)(pIVar27->field_1).t.irt < '\0') {
            asm_snap_prep(&local_408);
          }
          if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
          asm_ir(&local_408,pIVar27);
        }
      }
    } while ((local_408.realign != (MCode *)0x0) &&
            (pGVar15 = J->curfinal, T->nins <= pGVar15->nins));
    if (local_408.mcp < local_408.mclim) {
LAB_00140a35:
      asm_mclimit(&local_408);
    }
    if (0 < local_408.gcsteps) {
      local_408.curins = (IRRef)(local_408.T)->snap->ref;
      asm_snap_prep(&local_408);
      asm_gc_check(&local_408);
      local_408.curins = local_408.stopins;
    }
    for (uVar20 = ~local_408.freeset & 0xffff0000; uVar20 != 0;
        uVar20 = uVar20 & ~(1 << (uVar28 & 0x1f))) {
      uVar28 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
        }
      }
      uVar37 = (uint)(ushort)local_408.cost[uVar28];
      if ((uVar37 < 0x8000) && (ra_rematk(&local_408,uVar37), local_408.mcp < local_408.mclim))
      goto LAB_00140a35;
    }
    for (uVar20 = ~local_408.freeset & 0xffef; uVar20 != 0;
        uVar20 = uVar20 & ~(1 << (uVar28 & 0x1f))) {
      uVar28 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
        }
      }
      uVar37 = (uint)(ushort)local_408.cost[uVar28];
      if ((uVar37 < 0x8000) && (ra_rematk(&local_408,uVar37), local_408.mcp < local_408.mclim))
      goto LAB_00140a35;
    }
    if (local_408.parent != (GCtrace *)0x0) {
      pIVar27 = (local_408.parent)->ir;
      if ((local_408.snapno != 0) && ((local_408.parent)->topslot < local_408.topslot)) {
        asm_snap_alloc(&local_408,0);
      }
      bVar12 = *(byte *)((long)local_408.ir + 0x40006);
      uVar20 = 0x80;
      if (-1 < (char)bVar12) {
        uVar20 = (uint)bVar12;
        uVar28 = local_408.freeset | 1 << (uVar20 & 0x1f);
        local_408.freeset = uVar28;
        if (((local_408.modset >> (uVar20 & 0x1f) & 1) != 0) ||
           ((*(byte *)((long)local_408.ir + 0x40004) & 0x20) != 0)) {
          *(undefined1 *)((long)local_408.ir + 0x40006) = 0xff;
        }
        bVar11 = *(byte *)((long)pIVar27 + 0x40006);
        if (bVar11 != bVar12) {
          if (((char)bVar11 < '\0') || ((uVar28 >> (bVar11 & 0x1f) & 1) == 0)) {
            emit_rma(&local_408,XO_MOV,(uint)bVar12,local_408.J[-1].bpropcache + 0xc);
            uVar20 = 0x80;
          }
          else {
            emit_rr(&local_408,XO_MOV,(uint)bVar12,(uint)bVar11);
            uVar20 = (uint)*(byte *)((long)pIVar27 + 0x40006);
          }
        }
      }
      bVar12 = (byte)uVar20 & 0x1f;
      uVar37 = -2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12;
      uVar28 = uVar37 & 0xffef;
      if (uVar20 == 0x80) {
        uVar37 = 0xffffffef;
        uVar28 = 0xffef;
      }
      uVar25 = (ulong)local_408.stopins;
      lVar34 = uVar25 * 8;
      bVar10 = false;
      bVar9 = false;
      uVar20 = 0;
      for (; pIVar16 = local_408.ir, 0x8000 < uVar25; uVar25 = uVar25 - 1) {
        uVar13 = local_408.parentmap[(int)uVar25 - 0x8001];
        bVar12 = *(byte *)((long)local_408.ir + lVar34 + 6);
        uVar39 = (uint)bVar12;
        if ((char)bVar12 < '\0') {
          if (*(char *)((long)local_408.ir + lVar34 + 7) != '\0') {
            pbVar2 = (byte *)((long)local_408.ir + lVar34 + 4);
            *pbVar2 = *pbVar2 | 0x20;
            bVar9 = true;
          }
        }
        else {
          uVar37 = uVar37 & ~(1 << (bVar12 & 0x1f));
          if (*(char *)((long)local_408.ir + lVar34 + 7) != '\0') {
            ra_save(&local_408,(IRIns *)((long)local_408.ir + lVar34),(uint)bVar12);
            if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
            bVar12 = *(byte *)((long)pIVar16 + lVar34 + 6);
            uVar39 = (uint)bVar12;
          }
        }
        if (uVar39 == uVar13) {
          local_408.freeset = local_408.freeset | 1 << ((byte)uVar13 & 0x1f);
        }
        else if (uVar13 < 0x100) {
          if ((-1 < (char)bVar12) || (*(char *)((long)pIVar16 + lVar34 + 7) != '\0')) {
            *(short *)((long)&local_78[0].func + (ulong)(uint)uVar13 * 2) = (short)uVar25;
            uVar20 = uVar20 | 1 << (uVar13 & 0x1f);
          }
        }
        else if (-1 < (char)bVar12) {
          bVar10 = true;
        }
        bVar12 = (byte)uVar13 & 0x1f;
        uVar39 = -2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12;
        if (0xff < uVar13) {
          uVar39 = 0xffffffff;
        }
        uVar28 = uVar28 & uVar39;
        lVar34 = lVar34 + -8;
      }
      uVar39 = local_408.evenspill * 4 - 4U & 0xfffffff0;
      if (local_408.evenspill < 5) {
        uVar39 = 0;
      }
      iVar33 = uVar39 - (local_408.parent)->spadjust;
      iVar29 = iVar33;
      if (iVar33 < 1) {
        iVar29 = 0;
      }
      if (iVar33 < 0) {
        uVar39 = (uint)(local_408.parent)->spadjust;
      }
      (local_408.T)->spadjust = (uint16_t)uVar39;
      if (bVar9) {
        uVar25 = (ulong)local_408.stopins;
        lVar34 = uVar25 * 8;
        for (; 0x8000 < uVar25; uVar25 = uVar25 - 1) {
          bVar12 = *(byte *)((long)local_408.ir + uVar25 * 8 + 4);
          if ((bVar12 & 0x20) != 0) {
            *(byte *)((long)local_408.ir + uVar25 * 8 + 4) = bVar12 & 0xdf;
            uVar13 = local_408.parentmap[(IRRef)uVar25 - 0x8001];
            if (uVar13 < 0x100) {
              *(byte *)((long)local_408.ir + uVar25 * 8 + 6) = (byte)uVar13 | 0x80;
            }
            else if (iVar29 + (uint)(uVar13 >> 8) * 4 ==
                     (uint)*(byte *)((long)local_408.ir + uVar25 * 8 + 7) << 2) goto LAB_00140759;
            uVar39 = 0xffff0000;
            if (1 < (byte)((bVar12 & 0x1f) - 0xd)) {
              uVar39 = 0xffef;
            }
            if ((uVar39 & uVar37) == 0) goto LAB_00140be8;
            pIVar16 = (IRIns *)((long)local_408.ir + lVar34);
            RVar14 = ra_allocref(&local_408,(IRRef)uVar25,uVar39 & uVar37);
            ra_save(&local_408,pIVar16,RVar14);
            bVar12 = (byte)RVar14 & 0x1f;
            if (RVar14 == uVar13) {
              local_408.freeset = local_408.freeset | 1 << ((byte)RVar14 & 0x1f);
              uVar20 = uVar20 & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
            }
            else if (0xff < uVar13) {
              bVar10 = true;
            }
            if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
            uVar37 = uVar37 & ~(1 << (RVar14 & 0x1f));
          }
LAB_00140759:
          lVar34 = lVar34 + -8;
        }
      }
      *(uint *)(local_408.mcp + -4) = (uint)(local_408.T)->traceno;
      *(int *)(local_408.mcp + -8) = (int)local_408.J + -0xe8;
      local_408.mcp[-9] = '%';
      local_408.mcp[-0xb] = 199;
      local_408.mcp[-10] = '\x04';
      local_408.mcp = local_408.mcp + -0xb;
      emit_addptr(&local_408,0x80204,-iVar29);
      if (bVar10) {
        uVar39 = ~local_408.freeset & 0xffffffef;
        while (uVar39 != 0) {
          uVar38 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar13 = (ushort)local_408.cost[uVar38];
          uVar39 = uVar39 & ~(1 << (uVar38 & 0x1f));
          if (0xff < local_408.parentmap[uVar13 - 0x8001]) {
            local_408.freeset = local_408.freeset | 1 << ((byte)uVar38 & 0x1f);
            emit_loadofs(&local_408,local_408.ir + uVar13,uVar38,4,
                         local_408.parentmap[uVar13 - 0x8001] >> 6 & 0xfffffffc);
            if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
          }
        }
      }
      do {
        uVar39 = uVar20 & 0xffef;
        RVar14 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> RVar14 & 1) == 0; RVar14 = RVar14 + 1) {
          }
        }
        uVar38 = uVar20 & 0xffff0000;
        down = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> down & 1) == 0; down = down + 1) {
          }
        }
        while( true ) {
          uVar21 = local_408.freeset & uVar20;
          if (uVar21 != 0) break;
          if (uVar20 == 0) {
            bVar12 = (local_408.parent)->topslot;
            (local_408.T)->topslot = bVar12;
            if (bVar12 < local_408.topslot) {
              exitno = (local_408.J)->exitno;
              (local_408.T)->topslot = (uint8_t)local_408.topslot;
              asm_stack_check(&local_408,local_408.topslot,pIVar27 + 0x8000,uVar28,exitno);
            }
            goto LAB_00140995;
          }
          if (uVar39 != 0) {
            uVar21 = local_408.freeset & (uVar39 ^ 0xffef) & uVar37;
            if (uVar21 == 0) goto LAB_00140be8;
            RVar8 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> RVar8 & 1) == 0; RVar8 = RVar8 + 1) {
              }
            }
            ra_rename(&local_408,RVar14,RVar8);
          }
          if (uVar38 != 0) {
            uVar21 = local_408.freeset & (uVar38 ^ 0xffff0000) & uVar37;
            if (uVar21 == 0) goto LAB_00140be8;
            RVar8 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> RVar8 & 1) == 0; RVar8 = RVar8 + 1) {
              }
            }
            ra_rename(&local_408,down,RVar8);
          }
          if (local_408.mcp < local_408.mclim) goto LAB_00140a35;
        }
        uVar39 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
        pIVar16 = local_408.ir + *(ushort *)((long)&local_78[0].func + (ulong)uVar39 * 2);
        uVar20 = uVar20 & ~(1 << (uVar39 & 0x1f));
        uVar37 = uVar37 & ~(1 << (uVar39 & 0x1f));
        local_408.freeset = local_408.freeset | 1 << ((pIVar16->field_1).r & 0x1f);
        emit_movrr(&local_408,pIVar16,(uint)(pIVar16->field_1).r,uVar39);
      } while (local_408.mclim <= local_408.mcp);
      goto LAB_00140a35;
    }
    bVar12 = *(byte *)((long)local_408.ir + 0x40006);
    if (-1 < (char)bVar12) {
      local_408.freeset = local_408.freeset | 1 << (bVar12 & 0x1f);
      uVar20 = (uint)bVar12;
      if (((local_408.modset >> (uVar20 & 0x1f) & 1) != 0) ||
         ((*(byte *)((long)local_408.ir + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)((long)local_408.ir + 0x40006) = 0xff;
      }
      if (uVar20 != 2) {
        emit_rr(&local_408,XO_MOV,uVar20,2);
      }
    }
    *(uint *)(local_408.mcp + -4) = (uint)(local_408.T)->traceno;
    *(int *)(local_408.mcp + -8) = (int)local_408.J + -0xe8;
    local_408.mcp[-9] = '%';
    local_408.mcp[-0xb] = 199;
    local_408.mcp[-10] = '\x04';
    local_408.mcp = local_408.mcp + -0xb;
    uVar20 = local_408.evenspill * 4 - 4U & 0xfffffff0;
    if (local_408.evenspill < 5) {
      uVar20 = 0;
    }
    (local_408.T)->spadjust = (uint16_t)uVar20;
    emit_addptr(&local_408,0x80204,-uVar20);
    (local_408.T)->topslot = *(uint8_t *)((ulong)((local_408.T)->startpt).gcptr32 + 7);
LAB_00140995:
    for (RVar30 = local_408.phiset; RVar30 != 0; RVar30 = RVar30 & ~(1 << (uVar20 & 0x1f))) {
      uVar28 = RVar30 >> 0x18 | (RVar30 & 0xff0000) >> 8 | (RVar30 & 0xff00) << 8 | RVar30 << 0x18;
      uVar20 = 0x1f;
      if (uVar28 != 0) {
        for (; uVar28 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = uVar20 ^ 0x18;
      uVar13 = local_408.phireg[uVar20];
      uVar25 = (ulong)uVar13;
      bVar12 = *(byte *)((long)local_408.ir + uVar25 * 8 + 4);
      if (((bVar12 & 0x20) != 0) &&
         (*(byte *)((long)local_408.ir + uVar25 * 8 + 4) = bVar12 & 0xdf,
         *(char *)((long)local_408.ir + uVar25 * 8 + 7) != '\0')) {
        ra_addrename(&local_408,uVar20,(uint)uVar13,local_408.loopsnapno);
      }
    }
    pGVar15 = J->curfinal;
    if (pGVar15->nins < T->nins) {
      lj_trace_free((global_State *)(J[-1].penalty + 0x1b),pGVar15);
      J->curfinal = (GCtrace *)0x0;
      pGVar15 = lj_trace_alloc(J->L,T);
      J->curfinal = pGVar15;
      local_408.realign = (MCode *)0x0;
      goto LAB_0013f87f;
    }
    memcpy(pGVar15->ir + local_408.orignins,T->ir + local_408.orignins,
           (ulong)(T->nins - local_408.orignins) << 3);
    T->nins = J->curfinal->nins;
    local_408.curins = 0x8001;
    asm_snap_prev(&local_408);
    if (local_408.freeset == 0xffffffef) {
      T->mcode = local_408.mcp;
      MVar32 = 0;
      if (local_408.mcloop != (MCode *)0x0) {
        MVar32 = (int)local_408.mcloop - (int)local_408.mcp;
      }
      T->mcloop = MVar32;
      pMVar23 = local_408.mctop;
      if (local_408.loopref == 0) {
        uVar13 = T->link;
        uVar5 = (local_408.T)->spadjust;
        if (uVar5 == 0) {
          pMVar23 = local_408.mctop + -7;
        }
        else {
          if ((uint)uVar5 == (int)(char)(MCode)uVar5) {
            local_408.mctop[-9] = (MCode)uVar5;
            MVar19 = 0x83;
            pMVar23 = local_408.mctop + -3;
          }
          else {
            *(uint *)(local_408.mctop + -9) = (uint)uVar5;
            MVar19 = 0x81;
          }
          local_408.mctop[-0xc] = 'H';
          local_408.mctop[-0xb] = MVar19;
          local_408.mctop[-10] = 0xc4;
        }
        if ((ulong)uVar13 == 0) {
          iVar29 = 0x13dfd6;
        }
        else {
          iVar29 = (int)*(undefined8 *)((ulong)(local_408.J)->trace[uVar13].gcptr32 + 0x40);
        }
        *(int *)(pMVar23 + -4) = iVar29 - (int)pMVar23;
        pMVar23[-5] = 0xe9;
        while (local_408.mctop = local_408.mctop + -1, pMVar23 <= local_408.mctop) {
          *local_408.mctop = 0x90;
        }
      }
      local_408.mctop = pMVar23;
      T->szmcode = (int)local_408.mctop - (int)local_408.mcp;
      pSVar7 = (local_408.T)->snap;
      puVar22 = &pSVar7[(local_408.T)->nsnap - 1].mcofs;
      for (uVar20 = (local_408.T)->nsnap - 2; uVar20 != 0xffffffff; uVar20 = uVar20 - 1) {
        *puVar22 = ((short)local_408.mctoporig - (short)local_408.mcp) - pSVar7[uVar20].mcofs;
        puVar22 = puVar22 + -6;
      }
      pSVar7->mcofs = 0;
      lj_mcode_sync(T->mcode,local_408.mctoporig);
      return;
    }
    e = LJ_TRERR_BADRA;
  }
  else {
    e = LJ_TRERR_SNAPOV;
  }
LAB_00140bf2:
  lj_trace_err(local_408.J,e);
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (!as->loopref)
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}